

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O0

void BlendPlaneRow_SSSE3(uint8_t *src0,uint8_t *src1,uint8_t *alpha,uint8_t *dst,int width)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  undefined1 auVar11 [16];
  undefined1 auVar18 [16];
  ushort uVar32;
  ushort uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int width_local;
  uint8_t *dst_local;
  uint8_t *alpha_local;
  uint8_t *src1_local;
  uint8_t *src0_local;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 uVar19;
  
  auVar35[8] = 0xff;
  auVar35._0_8_ = 0xffffffffffffffff;
  auVar35[9] = 0xff;
  auVar35[10] = 0xff;
  auVar35[0xb] = 0xff;
  auVar35[0xc] = 0xff;
  auVar35[0xd] = 0xff;
  auVar35[0xe] = 0xff;
  auVar35[0xf] = 0xff;
  auVar35 = psllw(auVar35,8);
  lVar6 = (long)src0 - (long)alpha;
  lVar5 = (long)src1 - (long)alpha;
  lVar8 = (long)dst - (long)alpha;
  do {
    uVar1 = *(ulong *)alpha;
    uVar19 = (undefined1)(uVar1 >> 0x38);
    auVar17._8_6_ = 0;
    auVar17._0_8_ = uVar1;
    auVar17[0xe] = uVar19;
    auVar17[0xf] = uVar19;
    uVar19 = (undefined1)(uVar1 >> 0x30);
    auVar16._14_2_ = auVar17._14_2_;
    auVar16._8_5_ = 0;
    auVar16._0_8_ = uVar1;
    auVar16[0xd] = uVar19;
    auVar15._13_3_ = auVar16._13_3_;
    auVar15._8_4_ = 0;
    auVar15._0_8_ = uVar1;
    auVar15[0xc] = uVar19;
    uVar19 = (undefined1)(uVar1 >> 0x28);
    auVar14._12_4_ = auVar15._12_4_;
    auVar14._8_3_ = 0;
    auVar14._0_8_ = uVar1;
    auVar14[0xb] = uVar19;
    auVar13._11_5_ = auVar14._11_5_;
    auVar13._8_2_ = 0;
    auVar13._0_8_ = uVar1;
    auVar13[10] = uVar19;
    uVar19 = (undefined1)(uVar1 >> 0x20);
    auVar12._10_6_ = auVar13._10_6_;
    auVar12[8] = 0;
    auVar12._0_8_ = uVar1;
    auVar12[9] = uVar19;
    auVar11._9_7_ = auVar12._9_7_;
    auVar11[8] = uVar19;
    auVar11._0_8_ = uVar1;
    uVar19 = (undefined1)(uVar1 >> 0x18);
    auVar18._8_8_ = auVar11._8_8_;
    auVar18[7] = uVar19;
    auVar18[6] = uVar19;
    uVar19 = (undefined1)(uVar1 >> 0x10);
    auVar18[5] = uVar19;
    auVar18[4] = uVar19;
    uVar19 = (undefined1)(uVar1 >> 8);
    auVar18[3] = uVar19;
    auVar18[2] = uVar19;
    auVar18[0] = (undefined1)uVar1;
    auVar18[1] = auVar18[0];
    uVar2 = *(undefined8 *)(lVar6 + (long)alpha);
    uVar3 = *(undefined8 *)(lVar5 + (long)alpha);
    auVar34[0] = (char)uVar2 + -0x80;
    auVar34[1] = (char)uVar3 + -0x80;
    auVar34[2] = (char)((ulong)uVar2 >> 8) + -0x80;
    auVar34[3] = (char)((ulong)uVar3 >> 8) + -0x80;
    auVar34[4] = (char)((ulong)uVar2 >> 0x10) + -0x80;
    auVar34[5] = (char)((ulong)uVar3 >> 0x10) + -0x80;
    auVar34[6] = (char)((ulong)uVar2 >> 0x18) + -0x80;
    auVar34[7] = (char)((ulong)uVar3 >> 0x18) + -0x80;
    auVar34[8] = (char)((ulong)uVar2 >> 0x20) + -0x80;
    auVar34[9] = (char)((ulong)uVar3 >> 0x20) + -0x80;
    auVar34[10] = (char)((ulong)uVar2 >> 0x28) + -0x80;
    auVar34[0xb] = (char)((ulong)uVar3 >> 0x28) + -0x80;
    auVar34[0xc] = (char)((ulong)uVar2 >> 0x30) + -0x80;
    auVar34[0xd] = (char)((ulong)uVar3 >> 0x30) + -0x80;
    auVar34[0xe] = (char)((ulong)uVar2 >> 0x38) + -0x80;
    auVar34[0xf] = (char)((ulong)uVar3 >> 0x38) + -0x80;
    auVar18 = pmaddubsw(auVar18 ^ auVar35,auVar34);
    uVar9 = auVar18._0_2_ + 0x807f;
    uVar20 = auVar18._2_2_ + 0x807f;
    uVar22 = auVar18._4_2_ + 0x807f;
    uVar24 = auVar18._6_2_ + 0x807f;
    uVar26 = auVar18._8_2_ + 0x807f;
    uVar28 = auVar18._10_2_ + 0x807f;
    uVar30 = auVar18._12_2_ + 0x807f;
    uVar32 = auVar18._14_2_ + 0x807f;
    uVar10 = uVar9 >> 8;
    uVar21 = uVar20 >> 8;
    uVar23 = uVar22 >> 8;
    uVar25 = uVar24 >> 8;
    uVar27 = uVar26 >> 8;
    uVar29 = uVar28 >> 8;
    uVar31 = uVar30 >> 8;
    uVar33 = uVar32 >> 8;
    *(ulong *)(lVar8 + (long)alpha) =
         CONCAT17((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) - (0xff < uVar33),
                  CONCAT16((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8) - (0xff < uVar31),
                           CONCAT15((uVar29 != 0) * (uVar29 < 0x100) * (char)(uVar28 >> 8) -
                                    (0xff < uVar29),
                                    CONCAT14((uVar27 != 0) * (uVar27 < 0x100) * (char)(uVar26 >> 8)
                                             - (0xff < uVar27),
                                             CONCAT13((uVar25 != 0) * (uVar25 < 0x100) *
                                                      (char)(uVar24 >> 8) - (0xff < uVar25),
                                                      CONCAT12((uVar23 != 0) * (uVar23 < 0x100) *
                                                               (char)(uVar22 >> 8) - (0xff < uVar23)
                                                               ,CONCAT11((uVar21 != 0) *
                                                                         (uVar21 < 0x100) *
                                                                         (char)(uVar20 >> 8) -
                                                                         (0xff < uVar21),
                                                                         (uVar10 != 0) *
                                                                         (uVar10 < 0x100) *
                                                                         (char)(uVar9 >> 8) -
                                                                         (0xff < uVar10))))))));
    alpha = (uint8_t *)((long)alpha + 8);
    iVar7 = width + -8;
    bVar4 = 7 < width;
    width = iVar7;
  } while (iVar7 != 0 && bVar4);
  return;
}

Assistant:

void BlendPlaneRow_SSSE3(const uint8_t* src0,
                         const uint8_t* src1,
                         const uint8_t* alpha,
                         uint8_t* dst,
                         int width) {
  asm volatile(
      "pcmpeqb     %%xmm5,%%xmm5                 \n"
      "psllw       $0x8,%%xmm5                   \n"
      "mov         $0x80808080,%%eax             \n"
      "movd        %%eax,%%xmm6                  \n"
      "pshufd      $0x0,%%xmm6,%%xmm6            \n"
      "mov         $0x807f807f,%%eax             \n"
      "movd        %%eax,%%xmm7                  \n"
      "pshufd      $0x0,%%xmm7,%%xmm7            \n"
      "sub         %2,%0                         \n"
      "sub         %2,%1                         \n"
      "sub         %2,%3                         \n"

      // 8 pixel loop.
      LABELALIGN
      "1:                                        \n"
      "movq        (%2),%%xmm0                   \n"
      "punpcklbw   %%xmm0,%%xmm0                 \n"
      "pxor        %%xmm5,%%xmm0                 \n"
      "movq        (%0,%2,1),%%xmm1              \n"
      "movq        (%1,%2,1),%%xmm2              \n"
      "punpcklbw   %%xmm2,%%xmm1                 \n"
      "psubb       %%xmm6,%%xmm1                 \n"
      "pmaddubsw   %%xmm1,%%xmm0                 \n"
      "paddw       %%xmm7,%%xmm0                 \n"
      "psrlw       $0x8,%%xmm0                   \n"
      "packuswb    %%xmm0,%%xmm0                 \n"
      "movq        %%xmm0,(%3,%2,1)              \n"
      "lea         0x8(%2),%2                    \n"
      "sub         $0x8,%4                       \n"
      "jg          1b                            \n"
      : "+r"(src0),   // %0
        "+r"(src1),   // %1
        "+r"(alpha),  // %2
        "+r"(dst),    // %3
        "+rm"(width)  // %4
        ::"memory",
        "cc", "eax", "xmm0", "xmm1", "xmm2", "xmm5", "xmm6", "xmm7");
}